

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::NodeTranslator::compileNode(NodeTranslator *this,Reader decl,Builder builder)

{
  Reader nestedDecls;
  Reader annotations;
  Reader decl_00;
  Reader decl_01;
  Reader decl_02;
  Builder builder_00;
  Builder builder_01;
  Reader members;
  Builder builder_02;
  SegmentReader *pSVar1;
  StructDataBitCount SVar2;
  undefined4 uVar3;
  bool bVar4;
  Which parentKind;
  _func_int **pp_Var5;
  unsigned_long i;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  Reader RVar9;
  StringPtr targetsFlagName;
  size_t sStackY_350;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  int iVar17;
  undefined4 uVar18;
  Fault f;
  CapTableBuilder *local_2a8;
  uint local_298;
  Reader genericParams;
  BuilderFor<capnp::schema::Node::SourceInfo> di;
  Reader local_198;
  Builder local_168;
  Builder local_140;
  StructBuilder local_118;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Reader local_60;
  
  genericParams.reader.segment = (SegmentReader *)this->errorReporter;
  genericParams.reader._32_8_ = &genericParams.reader.ptr;
  genericParams.reader.ptr._0_4_ = 0;
  genericParams.reader.elementCount = 0;
  genericParams.reader.step = 0;
  genericParams.reader._40_8_ = genericParams.reader._32_8_;
  Declaration::Reader::getNestedDecls(&local_198,&decl);
  if (decl._reader.dataSize < 0x20) {
    parentKind = FILE;
  }
  else {
    parentKind = *(Which *)((long)decl._reader.data + 2);
  }
  uVar16 = local_198.reader._36_4_;
  nestedDecls.reader.capTable._0_4_ = (int)local_198.reader.capTable;
  nestedDecls.reader.segment = local_198.reader.segment;
  nestedDecls.reader.capTable._4_4_ = (int)((ulong)local_198.reader.capTable >> 0x20);
  nestedDecls.reader.ptr._0_4_ = (int)local_198.reader.ptr;
  nestedDecls.reader.ptr._4_4_ = (int)((ulong)local_198.reader.ptr >> 0x20);
  nestedDecls.reader.elementCount = local_198.reader.elementCount;
  nestedDecls.reader.step = local_198.reader.step;
  nestedDecls.reader.structDataSize = local_198.reader.structDataSize;
  nestedDecls.reader.structPointerCount = (short)uVar16;
  nestedDecls.reader.elementSize = (char)((uint)uVar16 >> 0x10);
  nestedDecls.reader._39_1_ = (char)((uint)uVar16 >> 0x18);
  nestedDecls.reader.nestingLimit = local_198.reader.nestingLimit;
  nestedDecls.reader._44_4_ = local_198.reader._44_4_;
  DuplicateNameDetector::check((DuplicateNameDetector *)&genericParams,nestedDecls,parentKind);
  std::
  _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
  ::~_Rb_tree((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>,_std::_Select1st<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>_>
               *)&genericParams.reader.capTable);
  Declaration::Reader::getParameters(&genericParams,&decl);
  if (genericParams.reader.elementCount != 0) {
    capnp::schema::Node::Builder::initParameters
              ((Builder *)&di,&builder,genericParams.reader.elementCount);
    uVar8 = genericParams.reader._24_8_ & 0xffffffff;
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      capnp::_::ListBuilder::getStructElement(&local_118,(ListBuilder *)&di,(ElementCount)uVar6);
      capnp::_::ListReader::getStructElement
                ((StructReader *)&f,&genericParams.reader,(ElementCount)uVar6);
      RVar9 = Declaration::BrandParameter::Reader::getName((Reader *)&f);
      capnp::schema::Node::Parameter::Builder::setName((Builder *)&local_118,RVar9);
    }
  }
  bVar4 = BrandScope::isGeneric((this->localBrand).ptr);
  uVar16 = decl._reader._36_4_;
  SVar2 = decl._reader.dataSize;
  pSVar1 = decl._reader.segment;
  *(byte *)((long)builder._builder.data + 0x24) =
       *(byte *)((long)builder._builder.data + 0x24) & 0xfe | bVar4;
  sStackY_350 = 0xc;
  pcVar7 = "targetsFile";
  if (0x1f < decl._reader.dataSize) {
    iVar17 = decl._reader.nestingLimit;
    uVar18 = decl._reader._44_4_;
    uVar12 = SUB84(decl._reader.data,0);
    uVar13 = (undefined4)((ulong)decl._reader.data >> 0x20);
    uVar14 = SUB84(decl._reader.pointers,0);
    uVar15 = (undefined4)((ulong)decl._reader.pointers >> 0x20);
    uVar10 = SUB84(decl._reader.capTable,0);
    uVar11 = (undefined4)((ulong)decl._reader.capTable >> 0x20);
    switch(*(undefined2 *)((long)decl._reader.data + 2)) {
    case 0:
      break;
    default:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x5c7,FAILED,(char *)0x0,"\"This Declaration is not a node.\"",
                 (char (*) [32])"This Declaration is not a node.");
      kj::_::Debug::Fault::fatal(&f);
    case 2:
      capnp::schema::Node::Builder::initConst(&local_140,&builder);
      uVar3 = decl._reader._36_4_;
      decl_00._reader.capTable._0_4_ = uVar10;
      decl_00._reader.segment = pSVar1;
      decl_00._reader.capTable._4_4_ = uVar11;
      decl_00._reader.data._0_4_ = uVar12;
      decl_00._reader.data._4_4_ = uVar13;
      decl_00._reader.pointers._0_4_ = uVar14;
      decl_00._reader.pointers._4_4_ = uVar15;
      decl_00._reader.dataSize = SVar2;
      decl._reader.pointerCount = (StructPointerCount)uVar16;
      decl._reader._38_2_ = SUB42(uVar16,2);
      decl_00._reader.pointerCount = decl._reader.pointerCount;
      decl_00._reader._38_2_ = decl._reader._38_2_;
      decl_00._reader.nestingLimit = iVar17;
      decl_00._reader._44_4_ = uVar18;
      builder_00._builder.capTable = local_140._builder.capTable;
      builder_00._builder.segment = local_140._builder.segment;
      builder_00._builder.data = local_140._builder.data;
      builder_00._builder.pointers = local_140._builder.pointers;
      builder_00._builder.dataSize = local_140._builder.dataSize;
      builder_00._builder.pointerCount = local_140._builder.pointerCount;
      builder_00._builder._38_2_ = local_140._builder._38_2_;
      decl._reader._36_4_ = uVar3;
      compileConst(this,decl_00,builder_00);
      sStackY_350 = 0xd;
      pcVar7 = "targetsConst";
      break;
    case 3:
      Declaration::Reader::getNestedDecls(&local_60,&decl);
      compileEnum(this);
      pcVar7 = "targetsEnum";
      break;
    case 5:
      Declaration::Reader::getNestedDecls(&local_90,&decl);
      compileStruct(this);
      sStackY_350 = 0xe;
      pcVar7 = "targetsStruct";
      break;
    case 9:
      Declaration::Reader::getNestedDecls(&local_c0,&decl);
      uVar3 = decl._reader._36_4_;
      decl_01._reader.capTable._0_4_ = uVar10;
      decl_01._reader.segment = pSVar1;
      decl_01._reader.capTable._4_4_ = uVar11;
      decl_01._reader.data._0_4_ = uVar12;
      decl_01._reader.data._4_4_ = uVar13;
      decl_01._reader.pointers._0_4_ = uVar14;
      decl_01._reader.pointers._4_4_ = uVar15;
      decl_01._reader.dataSize = SVar2;
      decl._reader.pointerCount = (StructPointerCount)uVar16;
      decl._reader._38_2_ = SUB42(uVar16,2);
      decl_01._reader.pointerCount = decl._reader.pointerCount;
      decl_01._reader._38_2_ = decl._reader._38_2_;
      decl_01._reader.nestingLimit = iVar17;
      decl_01._reader._44_4_ = uVar18;
      members.reader.capTable = local_c0.reader.capTable;
      members.reader.segment = local_c0.reader.segment;
      members.reader.ptr = local_c0.reader.ptr;
      members.reader.elementCount = local_c0.reader.elementCount;
      members.reader.step = local_c0.reader.step;
      members.reader.structDataSize = local_c0.reader.structDataSize;
      members.reader.structPointerCount = local_c0.reader.structPointerCount;
      members.reader.elementSize = local_c0.reader.elementSize;
      members.reader._39_1_ = local_c0.reader._39_1_;
      members.reader.nestingLimit = local_c0.reader.nestingLimit;
      members.reader._44_4_ = local_c0.reader._44_4_;
      builder_02._builder.capTable = builder._builder.capTable;
      builder_02._builder.segment = builder._builder.segment;
      builder_02._builder.data = builder._builder.data;
      builder_02._builder.pointers = builder._builder.pointers;
      builder_02._builder.dataSize = builder._builder.dataSize;
      builder_02._builder.pointerCount = builder._builder.pointerCount;
      builder_02._builder._38_2_ = builder._builder._38_2_;
      decl._reader._36_4_ = uVar3;
      compileInterface(this,decl_01,members,builder_02);
      sStackY_350 = 0x11;
      pcVar7 = "targetsInterface";
      break;
    case 0xb:
      capnp::schema::Node::Builder::initAnnotation(&local_168,&builder);
      uVar3 = decl._reader._36_4_;
      decl_02._reader.capTable._0_4_ = uVar10;
      decl_02._reader.segment = pSVar1;
      decl_02._reader.capTable._4_4_ = uVar11;
      decl_02._reader.data._0_4_ = uVar12;
      decl_02._reader.data._4_4_ = uVar13;
      decl_02._reader.pointers._0_4_ = uVar14;
      decl_02._reader.pointers._4_4_ = uVar15;
      decl_02._reader.dataSize = SVar2;
      decl._reader.pointerCount = (StructPointerCount)uVar16;
      decl._reader._38_2_ = SUB42(uVar16,2);
      decl_02._reader.pointerCount = decl._reader.pointerCount;
      decl_02._reader._38_2_ = decl._reader._38_2_;
      decl_02._reader.nestingLimit = iVar17;
      decl_02._reader._44_4_ = uVar18;
      builder_01._builder.capTable = local_168._builder.capTable;
      builder_01._builder.segment = local_168._builder.segment;
      builder_01._builder.data = local_168._builder.data;
      builder_01._builder.pointers = local_168._builder.pointers;
      builder_01._builder.dataSize = local_168._builder.dataSize;
      builder_01._builder.pointerCount = local_168._builder.pointerCount;
      builder_01._builder._38_2_ = local_168._builder._38_2_;
      decl._reader._36_4_ = uVar3;
      compileAnnotation(this,decl_02,builder_01);
      sStackY_350 = 0x12;
      pcVar7 = "targetsAnnotation";
    }
  }
  Declaration::Reader::getAnnotations(&local_f0,&decl);
  uVar16 = local_f0.reader._36_4_;
  annotations.reader.capTable._0_4_ = (int)local_f0.reader.capTable;
  annotations.reader.segment = local_f0.reader.segment;
  annotations.reader.capTable._4_4_ = (int)((ulong)local_f0.reader.capTable >> 0x20);
  annotations.reader.ptr._0_4_ = (int)local_f0.reader.ptr;
  annotations.reader.ptr._4_4_ = (int)((ulong)local_f0.reader.ptr >> 0x20);
  annotations.reader.elementCount = local_f0.reader.elementCount;
  annotations.reader.step = local_f0.reader.step;
  annotations.reader.structDataSize = local_f0.reader.structDataSize;
  annotations.reader.structPointerCount = (short)uVar16;
  annotations.reader.elementSize = (char)((uint)uVar16 >> 0x10);
  annotations.reader._39_1_ = (char)((uint)uVar16 >> 0x18);
  annotations.reader.nestingLimit = local_f0.reader.nestingLimit;
  annotations.reader._44_4_ = local_f0.reader._44_4_;
  targetsFlagName.content.size_ = sStackY_350;
  targetsFlagName.content.ptr = pcVar7;
  compileAnnotationApplications
            ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&f,this,annotations,
             targetsFlagName);
  capnp::schema::Node::Builder::adoptAnnotations
            (&builder,(Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&f);
  capnp::_::OrphanBuilder::~OrphanBuilder((OrphanBuilder *)&f);
  capnp::_::OrphanGetImpl<capnp::schema::Node::SourceInfo,_(capnp::Kind)3>::apply
            (&di,&(this->sourceInfo).builder);
  capnp::_::OrphanGetImpl<capnp::schema::Node,_(capnp::Kind)3>::applyReader
            ((Reader *)&f,&(this->wipNode).builder);
  if (local_298 < 0x40) {
    pp_Var5 = (_func_int **)0x0;
  }
  else {
    pp_Var5 = (local_2a8->super_CapTableReader)._vptr_CapTableReader;
  }
  *(_func_int ***)di._builder.data = pp_Var5;
  bVar4 = Declaration::Reader::hasDocComment(&decl);
  if (bVar4) {
    RVar9 = Declaration::Reader::getDocComment(&decl);
    capnp::schema::Node::SourceInfo::Builder::setDocComment(&di,RVar9);
  }
  return;
}

Assistant:

void NodeTranslator::compileNode(Declaration::Reader decl, schema::Node::Builder builder) {
  DuplicateNameDetector(errorReporter)
      .check(decl.getNestedDecls(), decl.which());

  auto genericParams = decl.getParameters();
  if (genericParams.size() > 0) {
    auto paramsBuilder = builder.initParameters(genericParams.size());
    for (auto i: kj::indices(genericParams)) {
      paramsBuilder[i].setName(genericParams[i].getName());
    }
  }

  builder.setIsGeneric(localBrand->isGeneric());

  kj::StringPtr targetsFlagName;

  switch (decl.which()) {
    case Declaration::FILE:
      targetsFlagName = "targetsFile";
      break;
    case Declaration::CONST:
      compileConst(decl.getConst(), builder.initConst());
      targetsFlagName = "targetsConst";
      break;
    case Declaration::ANNOTATION:
      compileAnnotation(decl.getAnnotation(), builder.initAnnotation());
      targetsFlagName = "targetsAnnotation";
      break;
    case Declaration::ENUM:
      compileEnum(decl.getEnum(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsEnum";
      break;
    case Declaration::STRUCT:
      compileStruct(decl.getStruct(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsStruct";
      break;
    case Declaration::INTERFACE:
      compileInterface(decl.getInterface(), decl.getNestedDecls(), builder);
      targetsFlagName = "targetsInterface";
      break;

    default:
      KJ_FAIL_REQUIRE("This Declaration is not a node.");
      break;
  }

  builder.adoptAnnotations(compileAnnotationApplications(decl.getAnnotations(), targetsFlagName));

  auto di = sourceInfo.get();
  di.setId(wipNode.getReader().getId());
  if (decl.hasDocComment()) {
    di.setDocComment(decl.getDocComment());
  }
}